

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# projectwriter.cpp
# Opt level: O2

void __thiscall ProjectWriter::writeDemands(ProjectWriter *this)

{
  undefined1 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer ppNVar3;
  Node *pNVar4;
  long lVar5;
  size_type sVar6;
  int iVar7;
  ostream *poVar8;
  pointer ppNVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  
  puVar1 = &this->field_0x18;
  std::operator<<((ostream *)puVar1,"\n[DEMANDS]\n");
  ppNVar3 = (this->network->nodes).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppNVar9 = (this->network->nodes).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppNVar9 != ppNVar3; ppNVar9 = ppNVar9 + 1) {
    pNVar4 = *ppNVar9;
    iVar7 = (*(pNVar4->super_Element)._vptr_Element[2])(pNVar4);
    if (iVar7 == 0) {
      lVar5 = *(long *)(*(long *)&this->field_0x18 + -0x18);
      *(uint *)(&this->field_0x30 + lVar5) =
           *(uint *)(&this->field_0x30 + lVar5) & 0xffffff4f | 0x20;
      paVar2 = &pNVar4[1].super_Element.name.field_2;
      paVar10 = paVar2;
      while (paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)paVar10->_M_allocated_capacity, paVar10 != paVar2) {
        *(undefined8 *)(&this->field_0x28 + *(long *)(*(long *)&this->field_0x18 + -0x18)) = 0x10;
        poVar8 = std::operator<<((ostream *)puVar1,(string *)&(pNVar4->super_Element).name);
        std::operator<<(poVar8," ");
        lVar5 = *(long *)&this->field_0x18;
        *(undefined8 *)(&this->field_0x28 + *(long *)(lVar5 + -0x18)) = 0xc;
        *(uint *)(&this->field_0x30 + *(long *)(lVar5 + -0x18)) =
             *(uint *)(&this->field_0x30 + *(long *)(lVar5 + -0x18)) & 0xfffffefb | 4;
        *(undefined8 *)(&this->field_0x20 + *(long *)(lVar5 + -0x18)) = 4;
        std::ostream::_M_insert<double>
                  ((double)(&paVar10->_M_allocated_capacity)[2] * (this->network->units).factors[5])
        ;
        sVar6 = (&paVar10->_M_allocated_capacity)[4];
        if (sVar6 != 0) {
          *(undefined8 *)(&this->field_0x28 + *(long *)(*(long *)&this->field_0x18 + -0x18)) = 0x10;
          std::operator<<((ostream *)puVar1,(string *)(sVar6 + 8));
        }
        std::operator<<((ostream *)puVar1,"\n");
      }
    }
  }
  return;
}

Assistant:

void ProjectWriter::writeDemands()
{
    fout << "\n[DEMANDS]\n";
    for (Node* node : network->nodes)
    {
        if ( node->type() == Node::JUNCTION )
    	{
    	    Junction* junc = static_cast<Junction*>(node);
    	    fout << left;
    	    auto demand = junc->demands.begin();
    	    while ( demand != junc->demands.end() )
    	    {
    	        fout << setw(16) << node->name << " ";
    	        fout << setw(12) << fixed << setprecision(4);
    	        fout << demand->baseDemand * network->ucf(Units::FLOW);
    	        if (demand->timePattern != 0)
    	        {
    	            fout << setw(16) << demand->timePattern->name;
    	        }
    	        fout << "\n";
    	        ++demand;
    	    }
    	}
    }
}